

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O3

void aom_highbd_dc_left_predictor_32x16_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  int iVar1;
  uint16_t *puVar2;
  ushort uVar3;
  short sVar6;
  ushort uVar7;
  ushort uVar8;
  short sVar9;
  ushort uVar10;
  ushort uVar11;
  short sVar12;
  ushort uVar13;
  ushort uVar14;
  undefined1 auVar4 [16];
  short sVar15;
  undefined1 auVar5 [16];
  ushort uVar16;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar17 [16];
  short sVar21;
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  short sVar22;
  short sVar24;
  short sVar25;
  short sVar27;
  
  auVar4 = *(undefined1 (*) [16])left;
  auVar5 = *(undefined1 (*) [16])(left + 8);
  sVar22 = auVar4._8_2_;
  auVar23._0_2_ = sVar22 + auVar4._0_2_;
  sVar12 = auVar4._10_2_;
  auVar23._2_2_ = sVar12 + auVar4._2_2_;
  sVar24 = auVar4._12_2_;
  auVar23._4_2_ = sVar24 + auVar4._4_2_;
  sVar15 = auVar4._14_2_;
  auVar23._6_2_ = sVar15 + auVar4._6_2_;
  auVar23._8_2_ = sVar22;
  auVar23._10_2_ = sVar12;
  auVar23._12_2_ = sVar24;
  auVar23._14_2_ = sVar15;
  auVar4 = pshuflw(auVar4,auVar23,0xe);
  sVar6 = auVar4._2_2_ + auVar23._2_2_;
  sVar9 = auVar4._6_2_ + auVar23._6_2_;
  sVar12 = auVar4._10_2_ + sVar12;
  sVar15 = auVar4._14_2_ + sVar15;
  sVar25 = auVar5._8_2_;
  auVar26._0_2_ = sVar25 + auVar5._0_2_;
  sVar20 = auVar5._10_2_;
  auVar26._2_2_ = sVar20 + auVar5._2_2_;
  sVar27 = auVar5._12_2_;
  auVar26._4_2_ = sVar27 + auVar5._4_2_;
  sVar21 = auVar5._14_2_;
  auVar26._6_2_ = sVar21 + auVar5._6_2_;
  auVar26._8_2_ = sVar25;
  auVar26._10_2_ = sVar20;
  auVar26._12_2_ = sVar27;
  auVar26._14_2_ = sVar21;
  auVar17 = pshuflw(auVar5,auVar26,0xe);
  sVar18 = auVar17._2_2_ + auVar26._2_2_;
  sVar19 = auVar17._6_2_ + auVar26._6_2_;
  sVar20 = auVar17._10_2_ + sVar20;
  sVar21 = auVar17._14_2_ + sVar21;
  auVar5._2_2_ = sVar6 + sVar18;
  auVar5._6_2_ = sVar9 + sVar19;
  auVar5._10_2_ = sVar12 + sVar20;
  auVar5._14_2_ = sVar15 + sVar21;
  auVar5._0_2_ = auVar4._0_2_ + auVar23._0_2_ + auVar17._0_2_ + auVar26._0_2_ + sVar6 + sVar18 + 8;
  auVar5._4_2_ = auVar4._4_2_ + auVar23._4_2_ + auVar17._4_2_ + auVar26._4_2_ + sVar9 + sVar19 + 8;
  auVar5._8_2_ = auVar4._8_2_ + sVar22 + auVar17._8_2_ + sVar25 + sVar12 + sVar20 + 8;
  auVar5._12_2_ = auVar4._12_2_ + sVar24 + auVar17._12_2_ + sVar27 + sVar15 + sVar21 + 8;
  auVar4 = pshuflw(auVar5,auVar5,0);
  uVar14 = auVar4._0_2_;
  uVar3 = uVar14 >> 4;
  uVar16 = auVar4._2_2_;
  uVar7 = uVar16 >> 4;
  uVar8 = uVar14 >> 4;
  uVar10 = uVar16 >> 4;
  uVar11 = uVar14 >> 4;
  uVar13 = uVar16 >> 4;
  uVar14 = uVar14 >> 4;
  uVar16 = uVar16 >> 4;
  puVar2 = dst + 0x18;
  iVar1 = 0x10;
  do {
    puVar2[-0x18] = uVar3;
    puVar2[-0x17] = uVar7;
    puVar2[-0x16] = uVar8;
    puVar2[-0x15] = uVar10;
    puVar2[-0x14] = uVar11;
    puVar2[-0x13] = uVar13;
    puVar2[-0x12] = uVar14;
    puVar2[-0x11] = uVar16;
    puVar2[-0x10] = uVar3;
    puVar2[-0xf] = uVar7;
    puVar2[-0xe] = uVar8;
    puVar2[-0xd] = uVar10;
    puVar2[-0xc] = uVar11;
    puVar2[-0xb] = uVar13;
    puVar2[-10] = uVar14;
    puVar2[-9] = uVar16;
    puVar2[-8] = uVar3;
    puVar2[-7] = uVar7;
    puVar2[-6] = uVar8;
    puVar2[-5] = uVar10;
    puVar2[-4] = uVar11;
    puVar2[-3] = uVar13;
    puVar2[-2] = uVar14;
    puVar2[-1] = uVar16;
    *puVar2 = uVar3;
    puVar2[1] = uVar7;
    puVar2[2] = uVar8;
    puVar2[3] = uVar10;
    puVar2[4] = uVar11;
    puVar2[5] = uVar13;
    puVar2[6] = uVar14;
    puVar2[7] = uVar16;
    puVar2 = puVar2 + stride;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void aom_highbd_dc_left_predictor_32x16_sse2(uint16_t *dst, ptrdiff_t stride,
                                             const uint16_t *above,
                                             const uint16_t *left, int bd) {
  const __m128i eight = _mm_cvtsi32_si128(8);
  const __m128i sum = dc_sum_16(left);
  const __m128i dc = _mm_srli_epi16(_mm_add_epi16(sum, eight), 4);
  (void)above;
  (void)bd;
  dc_store_32xh(dst, stride, 16, &dc);
}